

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# percent_decode.c
# Opt level: O3

void percent_decode_bs(BinarySink *bs,ptrlen data)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong in_RAX;
  ushort **ppuVar3;
  ulong uVar4;
  uchar *puVar5;
  uchar val;
  char *p;
  BinarySink *bs_00;
  uchar *puVar6;
  char hex [3];
  undefined8 uStack_38;
  
  puVar6 = (uchar *)data.ptr;
  if (0 < (long)data.len) {
    puVar5 = puVar6 + data.len;
    uStack_38 = in_RAX;
    do {
      val = *puVar6;
      if ((long)puVar5 - (long)puVar6 < 3 || val != '%') {
LAB_00135bc4:
        bs_00 = bs->binarysink_;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        pbVar1 = puVar6 + 1;
        if (((*(byte *)((long)*ppuVar3 + (ulong)*pbVar1 * 2 + 1) & 0x10) == 0) ||
           (pbVar2 = puVar6 + 2, (*(byte *)((long)*ppuVar3 + (ulong)*pbVar2 * 2 + 1) & 0x10) == 0))
        goto LAB_00135bc4;
        puVar6 = puVar6 + 2;
        uStack_38 = (ulong)CONCAT16(*pbVar2,CONCAT15(*pbVar1,(undefined5)uStack_38));
        bs_00 = bs->binarysink_;
        uVar4 = strtoul((char *)((long)&uStack_38 + 5),(char **)0x0,0x10);
        val = (uchar)uVar4;
      }
      BinarySink_put_byte(bs_00,val);
      puVar6 = puVar6 + 1;
    } while (puVar6 < puVar5);
  }
  return;
}

Assistant:

void percent_decode_bs(BinarySink *bs, ptrlen data)
{
    for (const char *p = data.ptr, *e = ptrlen_end(data); p < e; p++) {
        char c = *p;
        if (c == '%' && e-p >= 3 &&
            isxdigit((unsigned char)p[1]) &&
            isxdigit((unsigned char)p[2])) {
            char hex[3];
            hex[0] = p[1];
            hex[1] = p[2];
            hex[2] = '\0';
            put_byte(bs, strtoul(hex, NULL, 16));
            p += 2;
        } else {
            put_byte(bs, c);
        }
    }

}